

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

int fast_detect_non_zero_motion
              (AV1_COMP *cpi,uint8_t *src_y,int src_ystride,uint8_t *last_src_y,int last_src_ystride
              ,int mi_row,int mi_col)

{
  uint uVar1;
  long in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  uint sad_arr [4];
  uint8_t *search_pos [4];
  int sbi_row;
  int sbi_col;
  int sb_cols;
  int sb_size_by_mb;
  uint blk_sad;
  BLOCK_SIZE bsize;
  AV1_COMMON *cm;
  bool local_7d;
  int local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  byte local_31;
  long *local_30;
  int local_24;
  long local_20;
  undefined4 local_14;
  undefined8 local_10;
  long *local_8;
  
  local_30 = in_RDI + 0x77f0;
  local_31 = *(byte *)(in_RDI[0x8401] + 0x1c);
  local_38 = 0x7fffffff;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RDI[0x13ac9] == 0) {
    local_38 = (**(code **)(*in_RDI + 0xc900 + (ulong)local_31 * 0x70))(in_RSI,in_EDX,in_RCX);
  }
  else {
    if (local_31 == 0xf) {
      local_7c = *(int *)(in_RDI[0x8401] + 0x20) >> 1;
    }
    else {
      local_7c = *(int *)(in_RDI[0x8401] + 0x20);
    }
    local_3c = local_7c;
    local_40 = ((int)in_RDI[0x7833] + local_7c + -1) / local_7c;
    local_44 = in_stack_00000008 / local_7c;
    local_48 = in_R9D / local_7c;
    local_38 = (int)*(undefined8 *)(in_RDI[0x13ac9] + (long)(local_44 + local_48 * local_40) * 8);
  }
  local_68 = local_20 - local_24;
  local_60 = local_20 + -1;
  local_58 = local_20 + 1;
  local_50 = local_20 + local_24;
  (**(code **)(*local_8 + (ulong)local_31 * 0x70 + 0xc930))
            (local_10,local_14,&local_68,local_24,&local_78);
  uVar1 = (uint)(local_38 * 5) >> 3;
  local_7d = false;
  if (((uVar1 < local_78) && (local_7d = false, uVar1 < local_74)) &&
     (local_7d = false, uVar1 < local_70)) {
    local_7d = uVar1 < local_6c;
  }
  return (int)local_7d;
}

Assistant:

static int fast_detect_non_zero_motion(AV1_COMP *cpi, const uint8_t *src_y,
                                       int src_ystride,
                                       const uint8_t *last_src_y,
                                       int last_src_ystride, int mi_row,
                                       int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  const BLOCK_SIZE bsize = cm->seq_params->sb_size;
  unsigned int blk_sad = INT_MAX;
  if (cpi->src_sad_blk_64x64 != NULL) {
    const int sb_size_by_mb = (bsize == BLOCK_128X128)
                                  ? (cm->seq_params->mib_size >> 1)
                                  : cm->seq_params->mib_size;
    const int sb_cols =
        (cm->mi_params.mi_cols + sb_size_by_mb - 1) / sb_size_by_mb;
    const int sbi_col = mi_col / sb_size_by_mb;
    const int sbi_row = mi_row / sb_size_by_mb;
    blk_sad = (unsigned int)cpi->src_sad_blk_64x64[sbi_col + sbi_row * sb_cols];
  } else {
    blk_sad = cpi->ppi->fn_ptr[bsize].sdf(src_y, src_ystride, last_src_y,
                                          last_src_ystride);
  }

  // Search 4 1-away points.
  const uint8_t *const search_pos[4] = {
    last_src_y - last_src_ystride,
    last_src_y - 1,
    last_src_y + 1,
    last_src_y + last_src_ystride,
  };
  unsigned int sad_arr[4];
  cpi->ppi->fn_ptr[bsize].sdx4df(src_y, src_ystride, search_pos,
                                 last_src_ystride, sad_arr);

  blk_sad = (blk_sad * 5) >> 3;
  return (blk_sad < sad_arr[0] && blk_sad < sad_arr[1] &&
          blk_sad < sad_arr[2] && blk_sad < sad_arr[3]);
}